

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

void __thiscall cli::Parser::enable_help(Parser *this)

{
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"h","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"help","");
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<bool_(cli::CallbackArgs_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/contrib/cmdparser/cmdparser.hpp:234:65)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<bool_(cli::CallbackArgs_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/contrib/cmdparser/cmdparser.hpp:234:65)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  set_callback<bool>(this,&local_40,&local_60,(function<bool_(cli::CallbackArgs_&)> *)&local_a0,
                     &local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void enable_help() {
			set_callback("h", "help", std::function<bool(CallbackArgs&)>([this](CallbackArgs& args){
				args.output << this->usage();
				throw std::bad_cast();
				return false;
			}));
		}